

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O2

void __thiscall
Assimp::SplitLargeMeshesProcess_Triangle::SplitMesh
          (SplitLargeMeshesProcess_Triangle *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  aiColor4D *paVar1;
  aiBone *paVar2;
  value_type vVar3;
  uint *puVar4;
  aiVector3D *paVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer __src;
  bool bVar22;
  uint c;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  Logger *this_00;
  aiMesh *this_01;
  ulong *puVar26;
  aiFace *paVar27;
  ulong uVar28;
  aiVector3D *paVar29;
  void *__s;
  aiColor4D *paVar30;
  aiBone **ppaVar31;
  aiBone *this_02;
  aiVertexWeight *__s_00;
  uint *puVar32;
  aiFace *paVar33;
  uint uVar34;
  uint uVar35;
  uint q;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  value_type *__x;
  long lVar39;
  uint local_4a4;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> avTempWeights;
  pair<aiMesh_*,_unsigned_int> local_438 [64];
  
  if (this->LIMIT < pMesh->mNumFaces) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Mesh exceeds the triangle limit. It will be split ...");
    uVar6 = pMesh->mNumFaces / this->LIMIT;
    uVar34 = uVar6 + 1;
    uVar23 = pMesh->mNumFaces / uVar34;
    local_4a4 = 0;
    for (uVar37 = 0; uVar37 < uVar34; uVar37 = uVar37 + 1) {
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      this_01->mNumFaces = uVar23;
      this_01->mMaterialIndex = pMesh->mMaterialIndex;
      if (this_01 != pMesh) {
        uVar35 = (pMesh->mName).length;
        (this_01->mName).length = uVar35;
        memcpy((this_01->mName).data,(pMesh->mName).data,(ulong)uVar35);
        (this_01->mName).data[uVar35] = '\0';
      }
      uVar35 = uVar23;
      if (uVar37 == uVar6) {
        uVar35 = (pMesh->mNumFaces - uVar23 * uVar34) + uVar23;
        this_01->mNumFaces = uVar35;
      }
      uVar28 = (ulong)uVar35;
      puVar26 = (ulong *)operator_new__(uVar28 * 0x10 + 8);
      *puVar26 = uVar28;
      paVar27 = (aiFace *)(puVar26 + 1);
      if (uVar35 != 0) {
        paVar33 = paVar27;
        do {
          paVar33->mNumIndices = 0;
          paVar33->mIndices = (uint *)0x0;
          paVar33 = paVar33 + 1;
        } while (paVar33 != paVar27 + uVar28);
      }
      this_01->mFaces = paVar27;
      uVar24 = uVar37 * uVar23;
      uVar36 = 0;
      for (uVar28 = (ulong)local_4a4; uVar28 < uVar35 + uVar24; uVar28 = uVar28 + 1) {
        uVar36 = uVar36 + pMesh->mFaces[uVar28].mNumIndices;
      }
      this_01->mNumVertices = uVar36;
      uVar28 = (ulong)uVar36;
      if (pMesh->mVertices != (aiVector3D *)0x0) {
        paVar29 = (aiVector3D *)operator_new__(uVar28 * 0xc);
        if (uVar36 != 0) {
          uVar38 = uVar28 * 0xc - 0xc;
          memset(paVar29,0,(uVar38 - uVar38 % 0xc) + 0xc);
        }
        this_01->mVertices = paVar29;
      }
      if ((pMesh->mNormals != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
        paVar29 = (aiVector3D *)operator_new__(uVar28 * 0xc);
        if (uVar36 != 0) {
          uVar38 = uVar28 * 0xc - 0xc;
          memset(paVar29,0,(uVar38 - uVar38 % 0xc) + 0xc);
        }
        this_01->mNormals = paVar29;
      }
      bVar22 = aiMesh::HasTangentsAndBitangents(pMesh);
      uVar38 = uVar28 * 0xc;
      if (bVar22) {
        paVar29 = (aiVector3D *)operator_new__(uVar38);
        if (uVar36 != 0) {
          memset(paVar29,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
        }
        this_01->mTangents = paVar29;
        paVar29 = (aiVector3D *)operator_new__(uVar38);
        if (uVar36 != 0) {
          memset(paVar29,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
        }
        this_01->mBitangents = paVar29;
      }
      uVar35 = pMesh->mNumVertices;
      for (lVar39 = 0; lVar39 != 0x20; lVar39 = lVar39 + 4) {
        *(undefined4 *)((long)this_01->mNumUVComponents + lVar39) =
             *(undefined4 *)((long)pMesh->mNumUVComponents + lVar39);
        if (*(long *)((long)pMesh->mTextureCoords + lVar39 * 2) != 0 && uVar35 != 0) {
          __s = operator_new__(uVar38);
          if (uVar36 != 0) {
            memset(__s,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
          }
          *(void **)((long)this_01->mTextureCoords + lVar39 * 2) = __s;
        }
      }
      for (lVar39 = 6; lVar39 != 0xe; lVar39 = lVar39 + 1) {
        if (pMesh->mColors[lVar39 + -6] != (aiColor4D *)0x0 && uVar35 != 0) {
          paVar30 = (aiColor4D *)operator_new__(uVar28 << 4);
          if (uVar36 != 0) {
            memset(paVar30,0,uVar28 << 4);
          }
          this_01->mColors[lVar39 + -6] = paVar30;
        }
      }
      if (pMesh->mBones != (aiBone **)0x0 && pMesh->mNumBones != 0) {
        ppaVar31 = (aiBone **)operator_new__((ulong)pMesh->mNumBones << 3);
        this_01->mBones = ppaVar31;
        avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (uVar28 = 0; uVar28 < this_01->mNumBones; uVar28 = uVar28 + 1) {
          paVar2 = this_01->mBones[uVar28];
          if (avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                    (&avTempWeights,(ulong)paVar2->mNumWeights / (ulong)uVar34);
          lVar39 = 0;
          for (uVar38 = 0; uVar38 < paVar2->mNumWeights; uVar38 = uVar38 + 1) {
            uVar35 = *(uint *)((long)&paVar2->mWeights->mVertexId + lVar39);
            if ((uVar24 <= uVar35) && (uVar35 < (uVar37 + 3) * uVar23)) {
              __x = (value_type *)((long)&paVar2->mWeights->mVertexId + lVar39);
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                        (&avTempWeights,__x);
              vVar3 = avTempWeights.
                      super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
              *__x = vVar3;
              __x->mVertexId = vVar3.mVertexId - uVar24;
            }
            lVar39 = lVar39 + 8;
          }
          if (avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this_02 = (aiBone *)operator_new(0x460);
            aiBone::aiBone(this_02);
            uVar35 = this_01->mNumBones;
            this_01->mNumBones = uVar35 + 1;
            this_01->mBones[uVar35] = this_02;
            uVar35 = (paVar2->mName).length;
            if (0x3fe < uVar35) {
              uVar35 = 0x3ff;
            }
            uVar38 = (ulong)uVar35;
            local_438[0].first = (aiMesh *)CONCAT44(local_438[0].first._4_4_,uVar35);
            memcpy((void *)((long)&local_438[0].first + 4),(paVar2->mName).data,uVar38);
            *(undefined1 *)((long)&local_438[0].first + uVar38 + 4) = 0;
            (this_02->mName).length = uVar35;
            memcpy((this_02->mName).data,(void *)((long)&local_438[0].first + 4),uVar38);
            __src = avTempWeights.
                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
                    super__Vector_impl_data._M_start;
            (this_02->mName).data[uVar38] = '\0';
            uVar35 = (uint)((ulong)((long)avTempWeights.
                                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)avTempWeights.
                                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
            this_02->mNumWeights = uVar35;
            fVar7 = (paVar2->mOffsetMatrix).a2;
            fVar8 = (paVar2->mOffsetMatrix).a3;
            fVar9 = (paVar2->mOffsetMatrix).a4;
            fVar10 = (paVar2->mOffsetMatrix).b1;
            fVar11 = (paVar2->mOffsetMatrix).b2;
            fVar12 = (paVar2->mOffsetMatrix).b3;
            fVar13 = (paVar2->mOffsetMatrix).b4;
            fVar14 = (paVar2->mOffsetMatrix).c1;
            fVar15 = (paVar2->mOffsetMatrix).c2;
            fVar16 = (paVar2->mOffsetMatrix).c3;
            fVar17 = (paVar2->mOffsetMatrix).c4;
            fVar18 = (paVar2->mOffsetMatrix).d1;
            fVar19 = (paVar2->mOffsetMatrix).d2;
            fVar20 = (paVar2->mOffsetMatrix).d3;
            fVar21 = (paVar2->mOffsetMatrix).d4;
            (this_02->mOffsetMatrix).a1 = (paVar2->mOffsetMatrix).a1;
            (this_02->mOffsetMatrix).a2 = fVar7;
            (this_02->mOffsetMatrix).a3 = fVar8;
            (this_02->mOffsetMatrix).a4 = fVar9;
            (this_02->mOffsetMatrix).b1 = fVar10;
            (this_02->mOffsetMatrix).b2 = fVar11;
            (this_02->mOffsetMatrix).b3 = fVar12;
            (this_02->mOffsetMatrix).b4 = fVar13;
            (this_02->mOffsetMatrix).c1 = fVar14;
            (this_02->mOffsetMatrix).c2 = fVar15;
            (this_02->mOffsetMatrix).c3 = fVar16;
            (this_02->mOffsetMatrix).c4 = fVar17;
            (this_02->mOffsetMatrix).d1 = fVar18;
            (this_02->mOffsetMatrix).d2 = fVar19;
            (this_02->mOffsetMatrix).d3 = fVar20;
            (this_02->mOffsetMatrix).d4 = fVar21;
            if (uVar37 == uVar6) {
              this_02->mWeights = paVar2->mWeights;
              paVar2->mWeights = (aiVertexWeight *)0x0;
              __s_00 = this_02->mWeights;
              uVar35 = this_02->mNumWeights;
            }
            else {
              uVar38 = (long)avTempWeights.
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)avTempWeights.
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                             _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
              __s_00 = (aiVertexWeight *)operator_new__(uVar38);
              if (uVar35 != 0) {
                memset(__s_00,0,uVar38);
              }
              this_02->mWeights = __s_00;
            }
            memcpy(__s_00,__src,(ulong)uVar35 << 3);
          }
        }
        std::_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~_Vector_base
                  (&avTempWeights.
                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>);
      }
      uVar35 = 0;
      for (uVar28 = 0; uVar28 < this_01->mNumFaces; uVar28 = uVar28 + 1) {
        this_01->mFaces[uVar28].mNumIndices = 3;
        uVar25 = uVar24 + (int)uVar28;
        uVar36 = pMesh->mFaces[uVar25].mNumIndices;
        this_01->mFaces[uVar28].mNumIndices = uVar36;
        puVar4 = pMesh->mFaces[uVar25].mIndices;
        puVar32 = (uint *)operator_new__((ulong)uVar36 * 4);
        this_01->mFaces[uVar28].mIndices = puVar32;
        uVar25 = 8;
        if (uVar36 - 1 < 3) {
          uVar25 = *(uint *)(&DAT_005cd478 + (ulong)(uVar36 - 1) * 4);
        }
        this_01->mPrimitiveTypes = uVar25 | this_01->mPrimitiveTypes;
        for (uVar38 = 0; uVar38 != uVar36; uVar38 = uVar38 + 1) {
          uVar25 = puVar4[uVar38];
          puVar32[uVar38] = uVar35;
          paVar29 = pMesh->mVertices;
          if (paVar29 != (aiVector3D *)0x0) {
            paVar5 = this_01->mVertices;
            paVar5[uVar35].z = paVar29[uVar25].z;
            fVar7 = paVar29[uVar25].y;
            paVar5 = paVar5 + uVar35;
            paVar5->x = paVar29[uVar25].x;
            paVar5->y = fVar7;
          }
          paVar29 = pMesh->mNormals;
          if ((paVar29 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
            paVar5 = this_01->mNormals;
            paVar5[uVar35].z = paVar29[uVar25].z;
            fVar7 = paVar29[uVar25].y;
            paVar5 = paVar5 + uVar35;
            paVar5->x = paVar29[uVar25].x;
            paVar5->y = fVar7;
          }
          bVar22 = aiMesh::HasTangentsAndBitangents(pMesh);
          if (bVar22) {
            paVar29 = pMesh->mTangents;
            paVar5 = this_01->mTangents;
            paVar5[uVar35].z = paVar29[uVar25].z;
            paVar29 = paVar29 + uVar25;
            fVar7 = paVar29->y;
            paVar5 = paVar5 + uVar35;
            paVar5->x = paVar29->x;
            paVar5->y = fVar7;
            paVar29 = pMesh->mBitangents;
            paVar5 = this_01->mBitangents;
            paVar5[uVar35].z = paVar29[uVar25].z;
            paVar29 = paVar29 + uVar25;
            fVar7 = paVar29->y;
            paVar5 = paVar5 + uVar35;
            paVar5->x = paVar29->x;
            paVar5->y = fVar7;
          }
          for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
            paVar29 = pMesh->mTextureCoords[lVar39];
            if ((paVar29 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
              paVar5 = this_01->mTextureCoords[lVar39];
              paVar5[uVar35].z = paVar29[uVar25].z;
              fVar7 = paVar29[uVar25].y;
              paVar5 = paVar5 + uVar35;
              paVar5->x = paVar29[uVar25].x;
              paVar5->y = fVar7;
            }
          }
          for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
            if ((pMesh->mColors[lVar39] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
              paVar30 = pMesh->mColors[lVar39] + uVar25;
              fVar7 = paVar30->g;
              fVar8 = paVar30->b;
              fVar9 = paVar30->a;
              paVar1 = this_01->mColors[lVar39] + uVar35;
              paVar1->r = paVar30->r;
              paVar1->g = fVar7;
              paVar1->b = fVar8;
              paVar1->a = fVar9;
            }
          }
          uVar35 = uVar35 + 1;
        }
      }
      local_438[0].first = this_01;
      local_438[0].second = a;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      emplace_back<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)avList,local_438);
      local_4a4 = local_4a4 + uVar23;
    }
    if (pMesh != (aiMesh *)0x0) {
      aiMesh::~aiMesh(pMesh);
    }
    operator_delete(pMesh,0x520);
  }
  else {
    local_438[0].first = pMesh;
    local_438[0].second = a;
    std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
    emplace_back<std::pair<aiMesh*,unsigned_int>>
              ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                *)avList,local_438);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumFaces > SplitLargeMeshesProcess_Triangle::LIMIT) {
        ASSIMP_LOG_INFO("Mesh exceeds the triangle limit. It will be split ...");

        // we need to split this mesh into sub meshes
        // determine the size of a submesh
        const unsigned int iSubMeshes = (pMesh->mNumFaces / LIMIT) + 1;

        const unsigned int iOutFaceNum = pMesh->mNumFaces / iSubMeshes;
        const unsigned int iOutVertexNum = iOutFaceNum * 3;

        // now generate all submeshes
        for (unsigned int i = 0; i < iSubMeshes;++i) {
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumFaces       = iOutFaceNum;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            if (i == iSubMeshes-1) {
                pcMesh->mNumFaces = iOutFaceNum + (
                    pMesh->mNumFaces - iOutFaceNum * iSubMeshes);
            }
            // copy the list of faces
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            const unsigned int iBase = iOutFaceNum * i;

            // get the total number of indices
            unsigned int iCnt = 0;
            for (unsigned int p = iBase; p < pcMesh->mNumFaces + iBase;++p) {
                iCnt += pMesh->mFaces[p].mNumIndices;
            }
            pcMesh->mNumVertices = iCnt;

            // allocate storage
            if (pMesh->mVertices != nullptr) {
                pcMesh->mVertices = new aiVector3D[iCnt];
            }

            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iCnt];
            }

            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iCnt];
                pcMesh->mBitangents = new aiVector3D[iCnt];
            }

            // texture coordinates
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                if (pMesh->HasTextureCoords( c)) {
                    pcMesh->mTextureCoords[c] = new aiVector3D[iCnt];
                }
            }

            // vertex colors
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                if (pMesh->HasVertexColors( c)) {
                    pcMesh->mColors[c] = new aiColor4D[iCnt];
                }
            }

            if (pMesh->HasBones()) {
                // assume the number of bones won't change in most cases
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];

                // iterate through all bones of the mesh and find those which
                // need to be copied to the split mesh
                std::vector<aiVertexWeight> avTempWeights;
                for (unsigned int p = 0; p < pcMesh->mNumBones;++p) {
                    aiBone* const bone = pcMesh->mBones[p];
                    avTempWeights.clear();
                    avTempWeights.reserve(bone->mNumWeights / iSubMeshes);

                    for (unsigned int q = 0; q < bone->mNumWeights;++q) {
                        aiVertexWeight& weight = bone->mWeights[q];
                        if(weight.mVertexId >= iBase && weight.mVertexId < iBase + iOutVertexNum) {
                            avTempWeights.push_back(weight);
                            weight = avTempWeights.back();
                            weight.mVertexId -= iBase;
                        }
                    }

                    if (!avTempWeights.empty()) {
                        // we'll need this bone. Copy it ...
                        aiBone* pc = new aiBone();
                        pcMesh->mBones[pcMesh->mNumBones++] = pc;
                        pc->mName = aiString(bone->mName);
                        pc->mNumWeights = (unsigned int)avTempWeights.size();
                        pc->mOffsetMatrix = bone->mOffsetMatrix;

                        // no need to reallocate the array for the last submesh.
                        // Here we can reuse the (large) source array, although
                        // we'll waste some memory
                        if (iSubMeshes-1 == i) {
                            pc->mWeights = bone->mWeights;
                            bone->mWeights = nullptr;
                        } else {
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                        }

                        // copy the weights
                        ::memcpy(pc->mWeights,&avTempWeights[0],sizeof(aiVertexWeight)*pc->mNumWeights);
                    }
                }
            }

            // (we will also need to copy the array of indices)
            unsigned int iCurrent = 0;
            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p].mNumIndices = 3;
                // allocate a new array
                const unsigned int iTemp = p + iBase;
                const unsigned int iNumIndices = pMesh->mFaces[iTemp].mNumIndices;

                // setup face type and number of indices
                pcMesh->mFaces[p].mNumIndices = iNumIndices;
                unsigned int* pi = pMesh->mFaces[iTemp].mIndices;
                unsigned int* piOut = pcMesh->mFaces[p].mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (iNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pi[v];
                    unsigned int iIndexOut = iCurrent++;
                    piOut[v] = iIndexOut;

                    // copy positions
                    if (pMesh->mVertices != nullptr) {
                        pcMesh->mVertices[iIndexOut] = pMesh->mVertices[iIndex];
                    }

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[iIndexOut] = pMesh->mNormals[iIndex];
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[iIndexOut] = pMesh->mTangents[iIndex];
                        pcMesh->mBitangents[iIndexOut] = pMesh->mBitangents[iIndex];
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c ) ) {
                            pcMesh->mTextureCoords[c][iIndexOut] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][iIndexOut] = pMesh->mColors[c][iIndex];
                        }
                    }
                }
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));
        }

        // now delete the old mesh data
        delete pMesh;
    } else {
        avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
    }
}